

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O0

void extent_heap_remove(extent_heap_t *ph,extent_t *phn)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  extent_t *peVar6;
  extent_t *peVar7;
  extent_t *peVar8;
  extent_t *peVar9;
  extent_t *peVar10;
  int iVar11;
  extent_t *in_RSI;
  long *in_RDI;
  extent_t *next;
  extent_t *phn0child_19;
  extent_t *phn0child_18;
  extent_t *phn0child_17;
  extent_t *phn0child_16;
  extent_t *phn0child_15;
  extent_t *phn0child_14;
  extent_t *phnrest_2;
  extent_t *phn1_2;
  extent_t *phn0_2;
  extent_t *tail_2;
  extent_t *head_2;
  extent_t *lchild_1;
  extent_t *phn0child_13;
  extent_t *phn0child_12;
  extent_t *phn0child_11;
  extent_t *phn0child_10;
  extent_t *phn0child_9;
  extent_t *phn0child_8;
  extent_t *phnrest_1;
  extent_t *phn1_1;
  extent_t *phn0_1;
  extent_t *tail_1;
  extent_t *head_1;
  extent_t *lchild;
  extent_t *phn0child_7;
  extent_t *phn0child_6;
  extent_t *phn0child_5;
  extent_t *phn0child_4;
  extent_t *phn0child_3;
  extent_t *phn0child_2;
  extent_t *phn0child_1;
  extent_t *phn0child;
  extent_t *phnrest;
  extent_t *phn1;
  extent_t *phn0;
  extent_t *tail;
  extent_t *head;
  extent_t *phn_1;
  extent_t *parent;
  extent_t *replace;
  extent_t *in_stack_fffffffffffffeb0;
  extent_t *in_stack_fffffffffffffeb8;
  extent_t *local_118;
  extent_t *local_110;
  extent_t *local_108;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_48;
  long local_40;
  long local_38;
  extent_t *local_20;
  extent_t *local_18;
  
  if ((extent_t *)*in_RDI == in_RSI) {
    if ((in_RSI->ph_link).phn_lchild == (extent_t *)0x0) {
      *in_RDI = (long)(in_RSI->ph_link).phn_next;
      if (*in_RDI == 0) {
        return;
      }
      *(undefined8 *)(*in_RDI + 0x28) = 0;
      return;
    }
    lVar1 = *(long *)(*in_RDI + 0x30);
    if (lVar1 != 0) {
      *(undefined8 *)(*in_RDI + 0x28) = 0;
      *(undefined8 *)(*in_RDI + 0x30) = 0;
      *(undefined8 *)(lVar1 + 0x28) = 0;
      lVar2 = *(long *)(lVar1 + 0x30);
      local_40 = lVar1;
      if (lVar2 != 0) {
        lVar3 = *(long *)(lVar2 + 0x30);
        if (lVar3 != 0) {
          *(undefined8 *)(lVar3 + 0x28) = 0;
        }
        *(undefined8 *)(lVar1 + 0x28) = 0;
        *(undefined8 *)(lVar1 + 0x30) = 0;
        *(undefined8 *)(lVar2 + 0x28) = 0;
        *(undefined8 *)(lVar2 + 0x30) = 0;
        local_40 = lVar2;
        if ((lVar1 != 0) && (local_40 = lVar1, lVar2 != 0)) {
          iVar11 = extent_snad_comp(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
          if (iVar11 < 0) {
            *(long *)(lVar2 + 0x28) = lVar1;
            lVar5 = *(long *)(lVar1 + 0x38);
            *(long *)(lVar2 + 0x30) = lVar5;
            if (lVar5 != 0) {
              *(long *)(lVar5 + 0x28) = lVar2;
            }
            *(long *)(lVar1 + 0x38) = lVar2;
          }
          else {
            *(long *)(lVar1 + 0x28) = lVar2;
            lVar5 = *(long *)(lVar2 + 0x38);
            *(long *)(lVar1 + 0x30) = lVar5;
            if (lVar5 != 0) {
              *(long *)(lVar5 + 0x28) = lVar1;
            }
            *(long *)(lVar2 + 0x38) = lVar1;
            local_40 = lVar2;
          }
        }
        lVar1 = local_40;
        local_38 = local_40;
        local_40 = lVar3;
        while (local_40 != 0) {
          lVar2 = *(long *)(local_40 + 0x30);
          if (lVar2 == 0) {
            *(long *)(local_38 + 0x30) = local_40;
            local_38 = local_40;
            local_40 = 0;
          }
          else {
            lVar3 = *(long *)(lVar2 + 0x30);
            if (lVar3 != 0) {
              *(undefined8 *)(lVar3 + 0x28) = 0;
            }
            *(undefined8 *)(local_40 + 0x28) = 0;
            *(undefined8 *)(local_40 + 0x30) = 0;
            *(undefined8 *)(lVar2 + 0x28) = 0;
            *(undefined8 *)(lVar2 + 0x30) = 0;
            lVar5 = lVar2;
            if ((local_40 != 0) && (lVar5 = local_40, lVar2 != 0)) {
              iVar11 = extent_snad_comp(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
              if (iVar11 < 0) {
                *(long *)(lVar2 + 0x28) = local_40;
                lVar4 = *(long *)(local_40 + 0x38);
                *(long *)(lVar2 + 0x30) = lVar4;
                if (lVar4 != 0) {
                  *(long *)(lVar4 + 0x28) = lVar2;
                }
                *(long *)(local_40 + 0x38) = lVar2;
              }
              else {
                *(long *)(local_40 + 0x28) = lVar2;
                lVar5 = *(long *)(lVar2 + 0x38);
                *(long *)(local_40 + 0x30) = lVar5;
                if (lVar5 != 0) {
                  *(long *)(lVar5 + 0x28) = local_40;
                }
                *(long *)(lVar2 + 0x38) = local_40;
                lVar5 = lVar2;
              }
            }
            local_40 = lVar5;
            *(long *)(local_38 + 0x30) = local_40;
            local_38 = local_40;
            local_40 = lVar3;
          }
        }
        local_48 = *(long *)(lVar1 + 0x30);
        local_40 = lVar1;
        if (local_48 != 0) {
          while( true ) {
            lVar1 = *(long *)(local_48 + 0x30);
            *(undefined8 *)(local_40 + 0x30) = 0;
            *(undefined8 *)(local_48 + 0x30) = 0;
            if (local_40 == 0) {
              local_40 = local_48;
            }
            else if (local_48 != 0) {
              iVar11 = extent_snad_comp(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
              if (iVar11 < 0) {
                *(long *)(local_48 + 0x28) = local_40;
                lVar2 = *(long *)(local_40 + 0x38);
                *(long *)(local_48 + 0x30) = lVar2;
                if (lVar2 != 0) {
                  *(long *)(lVar2 + 0x28) = local_48;
                }
                *(long *)(local_40 + 0x38) = local_48;
              }
              else {
                *(long *)(local_40 + 0x28) = local_48;
                lVar2 = *(long *)(local_48 + 0x38);
                *(long *)(local_40 + 0x30) = lVar2;
                if (lVar2 != 0) {
                  *(long *)(lVar2 + 0x28) = local_40;
                }
                *(long *)(local_48 + 0x38) = local_40;
                local_40 = local_48;
              }
            }
            if (lVar1 == 0) break;
            *(long *)(local_38 + 0x30) = local_40;
            local_38 = local_40;
            local_48 = *(long *)(lVar1 + 0x30);
            local_40 = lVar1;
          }
        }
      }
      if (*in_RDI == 0) {
        *in_RDI = local_40;
      }
      else if (local_40 == 0) {
        *in_RDI = *in_RDI;
      }
      else {
        iVar11 = extent_snad_comp(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
        if (iVar11 < 0) {
          *(long *)(local_40 + 0x28) = *in_RDI;
          lVar1 = *(long *)(*in_RDI + 0x38);
          *(long *)(local_40 + 0x30) = lVar1;
          if (lVar1 != 0) {
            *(long *)(lVar1 + 0x28) = local_40;
          }
          *(long *)(*in_RDI + 0x38) = local_40;
          *in_RDI = *in_RDI;
        }
        else {
          *(long *)(*in_RDI + 0x28) = local_40;
          lVar1 = *(long *)(local_40 + 0x38);
          *(long *)(*in_RDI + 0x30) = lVar1;
          if (lVar1 != 0) {
            *(long *)(lVar1 + 0x28) = *in_RDI;
          }
          *(long *)(local_40 + 0x38) = *in_RDI;
          *in_RDI = local_40;
        }
      }
    }
    if ((extent_t *)*in_RDI == in_RSI) {
      lVar1 = *(long *)(*in_RDI + 0x38);
      if (lVar1 == 0) {
        *in_RDI = 0;
        return;
      }
      lVar2 = *(long *)(lVar1 + 0x30);
      local_b0 = lVar1;
      if (lVar2 != 0) {
        lVar3 = *(long *)(lVar2 + 0x30);
        if (lVar3 != 0) {
          *(undefined8 *)(lVar3 + 0x28) = 0;
        }
        *(undefined8 *)(lVar1 + 0x28) = 0;
        *(undefined8 *)(lVar1 + 0x30) = 0;
        *(undefined8 *)(lVar2 + 0x28) = 0;
        *(undefined8 *)(lVar2 + 0x30) = 0;
        local_b0 = lVar2;
        if ((lVar1 != 0) && (local_b0 = lVar1, lVar2 != 0)) {
          iVar11 = extent_snad_comp(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
          if (iVar11 < 0) {
            *(long *)(lVar2 + 0x28) = lVar1;
            lVar5 = *(long *)(lVar1 + 0x38);
            *(long *)(lVar2 + 0x30) = lVar5;
            if (lVar5 != 0) {
              *(long *)(lVar5 + 0x28) = lVar2;
            }
            *(long *)(lVar1 + 0x38) = lVar2;
          }
          else {
            *(long *)(lVar1 + 0x28) = lVar2;
            lVar5 = *(long *)(lVar2 + 0x38);
            *(long *)(lVar1 + 0x30) = lVar5;
            if (lVar5 != 0) {
              *(long *)(lVar5 + 0x28) = lVar1;
            }
            *(long *)(lVar2 + 0x38) = lVar1;
            local_b0 = lVar2;
          }
        }
        lVar1 = local_b0;
        local_a8 = local_b0;
        local_b0 = lVar3;
        while (local_b0 != 0) {
          lVar2 = *(long *)(local_b0 + 0x30);
          if (lVar2 == 0) {
            *(long *)(local_a8 + 0x30) = local_b0;
            local_a8 = local_b0;
            local_b0 = 0;
          }
          else {
            lVar3 = *(long *)(lVar2 + 0x30);
            if (lVar3 != 0) {
              *(undefined8 *)(lVar3 + 0x28) = 0;
            }
            *(undefined8 *)(local_b0 + 0x28) = 0;
            *(undefined8 *)(local_b0 + 0x30) = 0;
            *(undefined8 *)(lVar2 + 0x28) = 0;
            *(undefined8 *)(lVar2 + 0x30) = 0;
            lVar5 = lVar2;
            if ((local_b0 != 0) && (lVar5 = local_b0, lVar2 != 0)) {
              iVar11 = extent_snad_comp(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
              if (iVar11 < 0) {
                *(long *)(lVar2 + 0x28) = local_b0;
                lVar4 = *(long *)(local_b0 + 0x38);
                *(long *)(lVar2 + 0x30) = lVar4;
                if (lVar4 != 0) {
                  *(long *)(lVar4 + 0x28) = lVar2;
                }
                *(long *)(local_b0 + 0x38) = lVar2;
              }
              else {
                *(long *)(local_b0 + 0x28) = lVar2;
                lVar5 = *(long *)(lVar2 + 0x38);
                *(long *)(local_b0 + 0x30) = lVar5;
                if (lVar5 != 0) {
                  *(long *)(lVar5 + 0x28) = local_b0;
                }
                *(long *)(lVar2 + 0x38) = local_b0;
                lVar5 = lVar2;
              }
            }
            local_b0 = lVar5;
            *(long *)(local_a8 + 0x30) = local_b0;
            local_a8 = local_b0;
            local_b0 = lVar3;
          }
        }
        local_b8 = *(long *)(lVar1 + 0x30);
        local_b0 = lVar1;
        if (local_b8 != 0) {
          while( true ) {
            lVar1 = *(long *)(local_b8 + 0x30);
            *(undefined8 *)(local_b0 + 0x30) = 0;
            *(undefined8 *)(local_b8 + 0x30) = 0;
            if (local_b0 == 0) {
              local_b0 = local_b8;
            }
            else if (local_b8 != 0) {
              iVar11 = extent_snad_comp(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
              if (iVar11 < 0) {
                *(long *)(local_b8 + 0x28) = local_b0;
                lVar2 = *(long *)(local_b0 + 0x38);
                *(long *)(local_b8 + 0x30) = lVar2;
                if (lVar2 != 0) {
                  *(long *)(lVar2 + 0x28) = local_b8;
                }
                *(long *)(local_b0 + 0x38) = local_b8;
              }
              else {
                *(long *)(local_b0 + 0x28) = local_b8;
                lVar2 = *(long *)(local_b8 + 0x38);
                *(long *)(local_b0 + 0x30) = lVar2;
                if (lVar2 != 0) {
                  *(long *)(lVar2 + 0x28) = local_b0;
                }
                *(long *)(local_b8 + 0x38) = local_b0;
                local_b0 = local_b8;
              }
            }
            if (lVar1 == 0) break;
            *(long *)(local_a8 + 0x30) = local_b0;
            local_a8 = local_b0;
            local_b8 = *(long *)(lVar1 + 0x30);
            local_b0 = lVar1;
          }
        }
      }
      *in_RDI = local_b0;
      return;
    }
  }
  local_20 = (in_RSI->ph_link).phn_prev;
  if ((local_20 != (extent_t *)0x0) && ((local_20->ph_link).phn_lchild != in_RSI)) {
    local_20 = (extent_t *)0x0;
  }
  peVar6 = (in_RSI->ph_link).phn_lchild;
  if (peVar6 == (extent_t *)0x0) {
    local_18 = (extent_t *)0x0;
  }
  else {
    peVar7 = (peVar6->ph_link).phn_next;
    local_110 = peVar6;
    if (peVar7 != (extent_t *)0x0) {
      peVar8 = (peVar7->ph_link).phn_next;
      if (peVar8 != (extent_t *)0x0) {
        (peVar8->ph_link).phn_prev = (extent_t *)0x0;
      }
      (peVar6->ph_link).phn_prev = (extent_t *)0x0;
      (peVar6->ph_link).phn_next = (extent_t *)0x0;
      (peVar7->ph_link).phn_prev = (extent_t *)0x0;
      (peVar7->ph_link).phn_next = (extent_t *)0x0;
      local_110 = peVar7;
      if ((peVar6 != (extent_t *)0x0) && (local_110 = peVar6, peVar7 != (extent_t *)0x0)) {
        iVar11 = extent_snad_comp(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
        if (iVar11 < 0) {
          (peVar7->ph_link).phn_prev = peVar6;
          peVar10 = (peVar6->ph_link).phn_lchild;
          (peVar7->ph_link).phn_next = peVar10;
          if (peVar10 != (extent_t *)0x0) {
            (peVar10->ph_link).phn_prev = peVar7;
          }
          (peVar6->ph_link).phn_lchild = peVar7;
        }
        else {
          (peVar6->ph_link).phn_prev = peVar7;
          peVar10 = (peVar7->ph_link).phn_lchild;
          (peVar6->ph_link).phn_next = peVar10;
          if (peVar10 != (extent_t *)0x0) {
            (peVar10->ph_link).phn_prev = peVar6;
          }
          (peVar7->ph_link).phn_lchild = peVar6;
          local_110 = peVar7;
        }
      }
      peVar6 = local_110;
      local_108 = local_110;
      local_110 = peVar8;
      while (local_110 != (extent_t *)0x0) {
        peVar7 = (local_110->ph_link).phn_next;
        if (peVar7 == (extent_t *)0x0) {
          (local_108->ph_link).phn_next = local_110;
          local_108 = local_110;
          local_110 = (extent_t *)0x0;
        }
        else {
          peVar8 = (peVar7->ph_link).phn_next;
          if (peVar8 != (extent_t *)0x0) {
            (peVar8->ph_link).phn_prev = (extent_t *)0x0;
          }
          (local_110->ph_link).phn_prev = (extent_t *)0x0;
          (local_110->ph_link).phn_next = (extent_t *)0x0;
          (peVar7->ph_link).phn_prev = (extent_t *)0x0;
          (peVar7->ph_link).phn_next = (extent_t *)0x0;
          peVar10 = peVar7;
          if ((local_110 != (extent_t *)0x0) && (peVar10 = local_110, peVar7 != (extent_t *)0x0)) {
            iVar11 = extent_snad_comp(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
            if (iVar11 < 0) {
              (peVar7->ph_link).phn_prev = local_110;
              peVar9 = (local_110->ph_link).phn_lchild;
              (peVar7->ph_link).phn_next = peVar9;
              if (peVar9 != (extent_t *)0x0) {
                (peVar9->ph_link).phn_prev = peVar7;
              }
              (local_110->ph_link).phn_lchild = peVar7;
            }
            else {
              (local_110->ph_link).phn_prev = peVar7;
              peVar10 = (peVar7->ph_link).phn_lchild;
              (local_110->ph_link).phn_next = peVar10;
              if (peVar10 != (extent_t *)0x0) {
                (peVar10->ph_link).phn_prev = local_110;
              }
              (peVar7->ph_link).phn_lchild = local_110;
              peVar10 = peVar7;
            }
          }
          local_110 = peVar10;
          (local_108->ph_link).phn_next = local_110;
          local_108 = local_110;
          local_110 = peVar8;
        }
      }
      local_118 = (peVar6->ph_link).phn_next;
      local_110 = peVar6;
      if (local_118 != (extent_t *)0x0) {
        while( true ) {
          peVar6 = (local_118->ph_link).phn_next;
          (local_110->ph_link).phn_next = (extent_t *)0x0;
          (local_118->ph_link).phn_next = (extent_t *)0x0;
          if (local_110 == (extent_t *)0x0) {
            local_110 = local_118;
          }
          else if (local_118 != (extent_t *)0x0) {
            iVar11 = extent_snad_comp(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
            if (iVar11 < 0) {
              (local_118->ph_link).phn_prev = local_110;
              in_stack_fffffffffffffeb8 = (local_110->ph_link).phn_lchild;
              (local_118->ph_link).phn_next = in_stack_fffffffffffffeb8;
              if (in_stack_fffffffffffffeb8 != (extent_t *)0x0) {
                (in_stack_fffffffffffffeb8->ph_link).phn_prev = local_118;
              }
              (local_110->ph_link).phn_lchild = local_118;
            }
            else {
              (local_110->ph_link).phn_prev = local_118;
              in_stack_fffffffffffffeb0 = (local_118->ph_link).phn_lchild;
              (local_110->ph_link).phn_next = in_stack_fffffffffffffeb0;
              if (in_stack_fffffffffffffeb0 != (extent_t *)0x0) {
                (in_stack_fffffffffffffeb0->ph_link).phn_prev = local_110;
              }
              (local_118->ph_link).phn_lchild = local_110;
              local_110 = local_118;
            }
          }
          if (peVar6 == (extent_t *)0x0) break;
          (local_108->ph_link).phn_next = local_110;
          local_108 = local_110;
          local_118 = (peVar6->ph_link).phn_next;
          local_110 = peVar6;
        }
      }
    }
    local_18 = local_110;
  }
  if (local_18 == (extent_t *)0x0) {
    if (local_20 == (extent_t *)0x0) {
      (((in_RSI->ph_link).phn_prev)->ph_link).phn_next = (in_RSI->ph_link).phn_next;
    }
    else {
      peVar6 = (in_RSI->ph_link).phn_next;
      (local_20->ph_link).phn_lchild = peVar6;
      if (peVar6 != (extent_t *)0x0) {
        (peVar6->ph_link).phn_prev = local_20;
      }
    }
    if ((in_RSI->ph_link).phn_next != (extent_t *)0x0) {
      (((in_RSI->ph_link).phn_next)->ph_link).phn_prev = (in_RSI->ph_link).phn_prev;
    }
  }
  else {
    if (local_20 == (extent_t *)0x0) {
      (local_18->ph_link).phn_prev = (in_RSI->ph_link).phn_prev;
      if ((in_RSI->ph_link).phn_prev != (extent_t *)0x0) {
        (((in_RSI->ph_link).phn_prev)->ph_link).phn_next = local_18;
      }
    }
    else {
      (local_18->ph_link).phn_prev = local_20;
      (local_20->ph_link).phn_lchild = local_18;
    }
    (local_18->ph_link).phn_next = (in_RSI->ph_link).phn_next;
    if ((in_RSI->ph_link).phn_next != (extent_t *)0x0) {
      (((in_RSI->ph_link).phn_next)->ph_link).phn_prev = local_18;
    }
  }
  return;
}

Assistant:

bool
extents_init(tsdn_t *tsdn, extents_t *extents, extent_state_t state,
    bool delay_coalesce) {
	if (malloc_mutex_init(&extents->mtx, "extents", WITNESS_RANK_EXTENTS,
	    malloc_mutex_rank_exclusive)) {
		return true;
	}
	for (unsigned i = 0; i < SC_NPSIZES + 1; i++) {
		extent_heap_new(&extents->heaps[i]);
	}
	bitmap_init(extents->bitmap, &extents_bitmap_info, true);
	extent_list_init(&extents->lru);
	atomic_store_zu(&extents->npages, 0, ATOMIC_RELAXED);
	extents->state = state;
	extents->delay_coalesce = delay_coalesce;
	return false;
}